

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Maybe<kj::StringPtr> * kj::consumeWord(Maybe<kj::StringPtr> *__return_storage_ptr__,char **ptr)

{
  char *end_00;
  StringPtr local_50;
  char *local_40;
  char *end;
  char *local_28;
  char *p;
  char *start;
  char **ptr_local;
  
  start = (char *)ptr;
  ptr_local = (char **)__return_storage_ptr__;
  p = skipSpace(*ptr);
  local_28 = p;
  do {
    end_00 = local_28;
    switch(*local_28) {
    case '\0':
      *(char **)start = local_28;
      StringPtr::StringPtr((StringPtr *)&end,p,local_28);
      Maybe<kj::StringPtr>::Maybe(__return_storage_ptr__,(StringPtr *)&end);
      return __return_storage_ptr__;
    default:
      local_28 = local_28 + 1;
      break;
    case '\t':
    case ' ':
      local_40 = local_28;
      *(char **)start = local_28 + 1;
      *local_28 = '\0';
      local_28 = local_28 + 1;
      StringPtr::StringPtr(&local_50,p,end_00);
      Maybe<kj::StringPtr>::Maybe(__return_storage_ptr__,&local_50);
      return __return_storage_ptr__;
    case '\n':
    case '\r':
      Maybe<kj::StringPtr>::Maybe(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

static kj::Maybe<kj::StringPtr> consumeWord(char*& ptr) {
  char* start = skipSpace(ptr);
  char* p = start;

  for (;;) {
    switch (*p) {
      case '\0':
        ptr = p;
        return kj::StringPtr(start, p);

      case '\t':
      case ' ': {
        char* end = p++;
        ptr = p;
        *end = '\0';
        return kj::StringPtr(start, end);
      }

      case '\n':
      case '\r':
        // Not expecting EOL!
        return kj::none;

      default:
        ++p;
        break;
    }
  }
}